

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncCastEmulation.cpp
# Opt level: O0

Function * __thiscall
wasm::FuncCastEmulation::makeThunk(FuncCastEmulation *this,Name name,Module *module,Index numParams)

{
  size_t *this_00;
  Name target;
  Name name_00;
  Name name_01;
  bool bVar1;
  Function *pFVar2;
  Type type_00;
  LocalGet *value;
  Call *value_00;
  pointer pFVar3;
  Iterator IVar4;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar5;
  Name name_02;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_398;
  Type local_380;
  Type local_378;
  Signature local_370;
  HeapType local_360;
  char *local_358;
  HeapType HStack_350;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_340;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> thunkFunc;
  uint local_32c;
  undefined1 local_328 [4];
  Index i_1;
  vector<wasm::Type,_std::allocator<wasm::Type>_> thunkParams;
  Call *call;
  Type local_2e0;
  Expression *local_2d8;
  Type *local_2d0;
  Type *param;
  Iterator __end2;
  Iterator __begin2;
  Type *__range2;
  undefined1 local_290 [4];
  Index i;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> callOperands;
  Builder builder;
  Type type;
  Function *func;
  char *local_c8;
  size_t local_c0;
  string local_b8;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 auStack_40 [8];
  Name thunk;
  Index numParams_local;
  Module *module_local;
  FuncCastEmulation *this_local;
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  thunk.super_IString.str._M_str._4_4_ = numParams;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"byn$fpcast-emu$",&local_81);
  IString::toString_abi_cxx11_(&local_b8,(IString *)&this_local);
  std::operator+(&local_60,&local_80,&local_b8);
  wasm::Name::Name((Name *)auStack_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  local_c8 = (char *)auStack_40;
  local_c0 = thunk.super_IString.str._M_len;
  name_01.super_IString.str._M_str = (char *)thunk.super_IString.str._M_len;
  name_01.super_IString.str._M_len = (size_t)auStack_40;
  pFVar2 = Module::getFunctionOrNull(module,name_01);
  if (pFVar2 != (Function *)0x0) {
    Fatal::Fatal((Fatal *)&func);
    Fatal::operator<<((Fatal *)&func,
                      (char (*) [103])
                      "FuncCastEmulation::makeThunk seems a thunk name already in use. Was the pass already run on this code?"
                     );
    Fatal::~Fatal((Fatal *)&func);
  }
  name_00.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
  name_00.super_IString.str._M_len = (size_t)this_local;
  pFVar2 = Module::getFunction(module,name_00);
  type_00 = Function::getResults(pFVar2);
  Builder::Builder((Builder *)
                   &callOperands.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,module);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_290);
  __range2._4_4_ = 0;
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
       (size_t)Function::getParams(pFVar2);
  this_00 = &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
  IVar4 = wasm::Type::begin((Type *)this_00);
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
       (Type *)IVar4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
  __end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
       (size_t)IVar4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
  PVar5 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
          wasm::Type::end((Type *)this_00);
  while( true ) {
    __end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)PVar5.index;
    param = PVar5.parent;
    bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                      ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                       &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                        index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                              &param);
    if (!bVar1) break;
    local_2d0 = wasm::Type::Iterator::operator*
                          ((Iterator *)
                           &__end2.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index);
    wasm::Type::Type(&local_2e0,i64);
    value = Builder::makeLocalGet
                      ((Builder *)
                       &callOperands.
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,__range2._4_4_,local_2e0);
    local_2d8 = fromABI((Expression *)value,(Type)local_2d0->id,module);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_290,
               &local_2d8);
    ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
              ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
               &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
    PVar5.index = (size_t)__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                          .parent;
    PVar5.parent = param;
    __range2._4_4_ = __range2._4_4_ + 1;
  }
  target.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
  target.super_IString.str._M_len = (size_t)this_local;
  thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)type_00;
  value_00 = Builder::makeCall((Builder *)
                               &callOperands.
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,target,
                               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               local_290,type_00,false);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_328);
  for (local_32c = 0; local_32c < thunk.super_IString.str._M_str._4_4_; local_32c = local_32c + 1) {
    wasm::Type::Type((Type *)&thunkFunc,i64);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_328,(value_type *)&thunkFunc
              );
  }
  local_358 = (char *)auStack_40;
  HStack_350.id = thunk.super_IString.str._M_len;
  wasm::Type::Type(&local_378,(Tuple *)local_328);
  wasm::Type::Type(&local_380,i64);
  Signature::Signature(&local_370,local_378,local_380);
  HeapType::HeapType(&local_360,local_370);
  local_398.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_398.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_398);
  toABI((Expression *)value_00,module);
  name_02.super_IString.str._M_str = local_358;
  name_02.super_IString.str._M_len = (size_t)&local_340;
  Builder::makeFunction
            (name_02,HStack_350,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_360.id,
             (Expression *)&local_398);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_398);
  pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_340);
  (pFVar3->super_Importable).super_Named.hasExplicitName = true;
  pFVar2 = Module::addFunction(module,&local_340);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_340);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_328);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_290);
  return pFVar2;
}

Assistant:

Function* makeThunk(Name name, Module* module, Index numParams) {
    Name thunk = std::string("byn$fpcast-emu$") + name.toString();
    if (module->getFunctionOrNull(thunk)) {
      Fatal() << "FuncCastEmulation::makeThunk seems a thunk name already in "
                 "use. Was the pass already run on this code?";
    }
    // The item in the table may be a function or a function import.
    auto* func = module->getFunction(name);
    Type type = func->getResults();
    Builder builder(*module);
    std::vector<Expression*> callOperands;
    Index i = 0;
    for (const auto& param : func->getParams()) {
      callOperands.push_back(
        fromABI(builder.makeLocalGet(i++, Type::i64), param, module));
    }
    auto* call = builder.makeCall(name, callOperands, type);
    std::vector<Type> thunkParams;
    for (Index i = 0; i < numParams; i++) {
      thunkParams.push_back(Type::i64);
    }
    auto thunkFunc =
      builder.makeFunction(thunk,
                           Signature(Type(thunkParams), Type::i64),
                           {}, // no vars
                           toABI(call, module));
    thunkFunc->hasExplicitName = true;
    return module->addFunction(std::move(thunkFunc));
  }